

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainter.h
# Opt level: O2

void __thiscall QPainter::drawImage(QPainter *this,QRect *r,QImage *image)

{
  undefined4 uVar1;
  undefined4 uVar2;
  QImageData *pQVar3;
  double dVar4;
  double dVar5;
  long in_FS_OFFSET;
  undefined1 local_58 [32];
  QRectF local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QRectF::QRectF(&local_38,r);
  pQVar3 = image->d;
  dVar4 = 0.0;
  dVar5 = 0.0;
  if (pQVar3 != (QImageData *)0x0) {
    uVar1 = pQVar3->width;
    uVar2 = pQVar3->height;
    dVar4 = (double)(int)uVar1;
    dVar5 = (double)(int)uVar2;
  }
  local_58._0_8_ = 0.0;
  local_58._8_8_ = 0.0;
  local_58._24_4_ = SUB84(dVar5,0);
  local_58._16_8_ = dVar4;
  local_58._28_4_ = (int)((ulong)dVar5 >> 0x20);
  drawImage(this,&local_38,image,(QRectF *)local_58,(ImageConversionFlags)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void QPainter::drawImage(const QRect &r, const QImage &image)
{
    drawImage(r, image, QRectF(0, 0, image.width(), image.height()));
}